

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,StringTree *params_3,
          ArrayPtr<const_char> *params_4,CappedArray<char,_14UL> *params_5,
          ArrayPtr<const_char> *params_6,StringTree *params_7,ArrayPtr<const_char> *params_8,
          StringTree *params_9,ArrayPtr<const_char> *params_10,StringTree *params_11,
          ArrayPtr<const_char> *params_12,StringTree *params_13,ArrayPtr<const_char> *params_14,
          ArrayPtr<const_char> *params_15,StringTree *params_16,ArrayPtr<const_char> *params_17,
          ArrayPtr<const_char> *params_18,StringTree *params_19,StringTree *params_20,
          ArrayPtr<const_char> *params_21)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  long lVar4;
  Branch *pBVar5;
  const_iterator __begin2;
  char *pos;
  long lVar6;
  long lVar7;
  size_t elementCount;
  undefined1 local_138 [16];
  size_t local_128;
  char *local_120;
  undefined1 local_118 [16];
  undefined8 local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 local_c8 [16];
  char *local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  char *local_90;
  String local_80;
  StringTree *local_68;
  ArrayPtr<const_char> *local_60;
  ArrayPtr<const_char> *local_58;
  StringTree *local_50;
  StringTree *local_48;
  size_t local_40;
  char *local_38;
  
  lVar6 = 0;
  lVar7 = 0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_38 = (this->text).content.ptr;
  local_40 = params->size_;
  local_138._8_8_ = local_40;
  local_138._0_8_ = local_38;
  local_128 = params_1->size_;
  local_120 = params_2->ptr;
  local_118._0_8_ = (params_3->text).content.ptr;
  local_118._8_8_ = params_4->ptr;
  local_108 = *(undefined8 *)params_5->content;
  local_100 = params_6->ptr;
  local_f8 = (params_7->text).content.ptr;
  local_f0 = params_8->ptr;
  local_e8 = (params_9->text).content.ptr;
  local_e0 = params_10->ptr;
  local_d8 = (params_11->text).content.ptr;
  local_d0 = params_12->ptr;
  local_c8._0_8_ = (params_13->text).content.ptr;
  local_c8._8_8_ = params_14->size_;
  local_b8 = params_15->ptr;
  local_b0._0_8_ = (params_16->text).content.ptr;
  local_b0._8_8_ = params_17->size_;
  local_a0._8_8_ = params_19->size_;
  local_a0._0_8_ = params_18->ptr;
  local_90 = (params_20->text).content.ptr;
  lVar4 = 0;
  do {
    lVar6 = lVar6 + *(long *)(local_138 + lVar4 * 8);
    lVar7 = lVar7 + *(long *)(local_138 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x16);
  __return_storage_ptr__->size_ = lVar7 + lVar6;
  lVar4 = 0;
  local_120 = (char *)0x0;
  local_100 = (char *)0x0;
  local_f0 = (char *)0x0;
  local_e0 = (char *)0x0;
  local_d0 = (char *)0x0;
  local_b8 = (char *)0x0;
  lVar6 = 0;
  lVar7 = 0;
  local_a0 = (undefined1  [16])0x0;
  do {
    lVar6 = lVar6 + *(long *)(local_138 + lVar4 * 8);
    lVar7 = lVar7 + *(long *)(local_138 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x16);
  local_68 = this;
  local_60 = params;
  local_58 = params_1;
  local_50 = params_3;
  local_48 = (StringTree *)params_2;
  heapString(&local_80,lVar7 + lVar6);
  (__return_storage_ptr__->text).content.ptr = local_80.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_80.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_80.content.disposer;
  lVar4 = 0;
  local_128 = 0;
  lVar6 = 0;
  lVar7 = 0;
  local_138 = (undefined1  [16])0x0;
  local_120 = (char *)0x1;
  local_118 = (undefined1  [16])0x0;
  local_108 = 0;
  local_100 = (char *)0x1;
  local_f8 = (char *)0x0;
  local_f0 = (char *)0x1;
  local_e8 = (char *)0x0;
  local_e0 = (char *)0x1;
  local_d8 = (char *)0x0;
  local_d0 = (char *)0x1;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = (char *)0x1;
  local_b0 = (undefined1  [16])0x0;
  local_a0._8_8_ = 1;
  local_a0._0_8_ = 1;
  local_90 = (char *)0x0;
  do {
    lVar6 = lVar6 + *(long *)(local_138 + lVar4 * 8);
    lVar7 = lVar7 + *(long *)(local_138 + lVar4 * 8 + 8);
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x16);
  elementCount = lVar7 + lVar6;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_80.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_80.content.ptr = (char *)pBVar5;
  local_80.content.size_ = elementCount;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = elementCount;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_68,local_60,local_58,
             local_48,(ArrayPtr<const_char> *)local_50,(CappedArray<char,_14UL> *)params_4,
             (ArrayPtr<const_char> *)params_5,(StringTree *)params_6,
             (ArrayPtr<const_char> *)params_7,(StringTree *)params_8,
             (ArrayPtr<const_char> *)params_9,(StringTree *)params_10,
             (ArrayPtr<const_char> *)params_11,(StringTree *)params_12,
             (ArrayPtr<const_char> *)params_13,params_14,(StringTree *)params_15,
             (ArrayPtr<const_char> *)params_16,params_17,(StringTree *)params_18,params_19,
             (ArrayPtr<const_char> *)params_20);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}